

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterDcStatAccess.cpp
# Opt level: O0

long __thiscall bhf::ads::MasterDcStatAccess::Print(MasterDcStatAccess *this,ostream *os)

{
  ostream *poVar1;
  void *pvVar2;
  AdsException *this_00;
  size_type sVar3;
  const_reference pvVar4;
  ulong local_6f8;
  size_t i;
  allocator local_6e8;
  allocator local_6e7;
  allocator local_6e6;
  allocator local_6e5;
  allocator local_6e4;
  allocator local_6e3;
  allocator local_6e2;
  allocator local_6e1;
  string *local_6e0;
  undefined1 local_6d8 [8];
  array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  rowNames;
  stringstream local_578 [8];
  stringstream stream_2;
  ostream local_568 [376];
  string local_3f0 [32];
  stringstream local_3d0 [8];
  stringstream stream_1;
  ostream local_3c0 [376];
  string local_248 [48];
  stringstream local_218 [8];
  stringstream stream;
  ostream local_208 [376];
  MasterDcStatAccess *local_90;
  long status;
  uint local_80;
  anon_struct_96_6_2ef3beec stat;
  uint32_t bytesRead;
  ostream *os_local;
  MasterDcStatAccess *this_local;
  
  unique0x100009d0 = os;
  local_90 = (MasterDcStatAccess *)
             AdsDevice::ReadReqEx2
                       (&this->device,0x2f,0,0x60,(void *)((long)&status + 4),stat.negArr + 8);
  if (local_90 == (MasterDcStatAccess *)0x712) {
    std::__cxx11::stringstream::stringstream(local_218);
    poVar1 = std::operator<<(local_208,"Reading DC diagnosis failed with 0x");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(long)local_90);
    std::operator<<(poVar1,". Try activating it first (\'adstool dc-diag activate\').");
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_248);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::stringstream::~stringstream(local_218);
    this_local = local_90;
  }
  else if (local_90 == (MasterDcStatAccess *)0x0) {
    if (stat.negArr[8] != 0x60) {
      std::__cxx11::stringstream::stringstream(local_578);
      poVar1 = std::operator<<(local_568,"Print");
      std::operator<<(poVar1,"Corrupt ECAT_DC_TIMING_STAT length.\n");
      std::__cxx11::stringstream::str();
      Logger::Log(3,(string *)&rowNames.field_0x138);
      std::__cxx11::string::~string((string *)&rowNames.field_0x138);
      std::__cxx11::stringstream::~stringstream(local_578);
      this_00 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(this_00,0x706);
      __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
    }
    i._5_1_ = 1;
    local_6e0 = (string *)local_6d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_6d8,"1",&local_6e1);
    local_6e0 = (string *)&rowNames.field_0x18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0x18,"2",&local_6e2);
    local_6e0 = (string *)&rowNames.field_0x38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0x38,"5",&local_6e3);
    local_6e0 = (string *)&rowNames.field_0x58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0x58,"10",&local_6e4);
    local_6e0 = (string *)&rowNames.field_0x78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0x78,"20",&local_6e5);
    local_6e0 = (string *)&rowNames.field_0x98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0x98,"50",&local_6e6);
    local_6e0 = (string *)&rowNames.field_0xb8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0xb8,"100",&local_6e7);
    local_6e0 = (string *)&rowNames.field_0xd8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0xd8,"200",&local_6e8);
    local_6e0 = (string *)&rowNames.field_0xf8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&rowNames.field_0xf8,"500",(allocator *)((long)&i + 7));
    local_6e0 = (string *)&rowNames.field_0x118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&rowNames.field_0x118,anon_var_dwarf_27577,(allocator *)((long)&i + 6));
    i._5_1_ = 0;
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    std::allocator<char>::~allocator((allocator<char> *)&local_6e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e7);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e6);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e5);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e4);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e3);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e2);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    poVar1 = std::operator<<(stack0xffffffffffffffe0,"Deviation <");
    poVar1 = std::operator<<(poVar1," | ");
    poVar1 = std::operator<<(poVar1,"Count (neg)");
    poVar1 = std::operator<<(poVar1," | ");
    poVar1 = std::operator<<(poVar1,"Count (pos)");
    std::operator<<(poVar1,'\n');
    local_6f8 = 0;
    while( true ) {
      sVar3 = std::
              array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::size((array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                      *)local_6d8);
      poVar1 = stack0xffffffffffffffe0;
      if (sVar3 <= local_6f8) break;
      pvVar4 = std::
               array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
               ::operator[]((array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                             *)local_6d8,local_6f8);
      poVar1 = std::operator<<(poVar1,(string *)pvVar4);
      poVar1 = std::operator<<(poVar1," | ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,stat.posArr[local_6f8 + 8]);
      poVar1 = std::operator<<(poVar1," | ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,stat.posArr[local_6f8 - 2]);
      std::operator<<(poVar1,'\n');
      local_6f8 = local_6f8 + 1;
    }
    poVar1 = std::operator<<(stack0xffffffffffffffe0,"Sum");
    poVar1 = std::operator<<(poVar1," | ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,stat.count);
    poVar1 = std::operator<<(poVar1," | ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_80);
    std::operator<<(poVar1,'\n');
    this_local = local_90;
    std::
    array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
    ::~array((array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              *)local_6d8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_3d0);
    poVar1 = std::operator<<(local_3c0,"Reading DC diagnosis failed with 0x");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(pvVar2,(long)local_90);
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_3f0);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::stringstream::~stringstream(local_3d0);
    this_local = local_90;
  }
  return (long)this_local;
}

Assistant:

long MasterDcStatAccess::Print(std::ostream& os) const
{
    uint32_t bytesRead;

    struct {
        uint32_t count;
        uint32_t pos;
        uint32_t neg;
        uint32_t maxDiff;
        uint32_t posArr[10];
        uint32_t negArr[10];
    } stat;

    const auto status = device.ReadReqEx2(
        ECADS_IGRP_MASTER_DC_STAT,
        0,
        sizeof(stat),
        &stat,
        &bytesRead
        );

    if (status == ADSERR_DEVICE_INVALIDSTATE) {
        LOG_ERROR(
            "Reading DC diagnosis failed with 0x" << std::hex << status <<
                ". Try activating it first ('adstool dc-diag activate').");
        return status;
    } else if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading DC diagnosis failed with 0x" << std::hex << status);
        return status;
    } else if (bytesRead != sizeof(stat)) {
        LOG_ERROR(__FUNCTION__ << "Corrupt ECAT_DC_TIMING_STAT length.\n");
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }

    const std::array<const std::string, sizeof(stat.posArr) / sizeof(stat.posArr[0])> rowNames{{
        "1",
        "2",
        "5",
        "10",
        "20",
        "50",
        "100",
        "200",
        "500",
        "\u221E" // infinity symbol
    }};

    os << "Deviation <" << " | " << "Count (neg)" << " | " << "Count (pos)" << '\n';
    for (size_t i = 0; i < rowNames.size(); i++) {
        os << rowNames[i] << " | " << stat.negArr[i] << " | " << stat.posArr[i] << '\n';
    }
    os << "Sum" << " | " << stat.neg << " | " << stat.pos << '\n';

    return status;
}